

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O0

void __thiscall miniros::RPCManager::~RPCManager(RPCManager *this)

{
  int in_EDX;
  int in_ESI;
  RPCManager *in_RDI;
  XmlRpcServer *unaff_retaddr;
  
  shutdown(in_RDI,in_ESI,in_EDX);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
          *)0x495a3b);
  std::
  set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  ::~set((set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
          *)0x495a4c);
  std::
  set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  ::~set((set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
          *)0x495a5d);
  std::
  set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  ::~set((set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
          *)0x495a6e);
  WallDuration::~WallDuration((WallDuration *)0x495a7f);
  std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>::~vector
            ((vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_> *)
             unaff_retaddr);
  XmlRpc::XmlRpcServer::~XmlRpcServer(unaff_retaddr);
  std::thread::~thread((thread *)0x495aac);
  std::__cxx11::string::~string((string *)in_RDI);
  return;
}

Assistant:

RPCManager::~RPCManager()
{
  shutdown();
}